

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

void xmlRngVErrMemory(xmlRelaxNGValidCtxtPtr ctxt,char *extra)

{
  void *data;
  xmlGenericErrorFunc channel;
  xmlStructuredErrorFunc schannel;
  char *msg;
  
  if (ctxt == (xmlRelaxNGValidCtxtPtr)0x0) {
    schannel = (xmlStructuredErrorFunc)0x0;
    channel = (xmlGenericErrorFunc)0x0;
    data = (void *)0x0;
  }
  else {
    schannel = ctxt->serror;
    if (schannel == (xmlStructuredErrorFunc)0x0) {
      channel = ctxt->error;
      schannel = (xmlStructuredErrorFunc)0x0;
    }
    else {
      channel = (xmlGenericErrorFunc)0x0;
    }
    data = ctxt->userData;
    ctxt->nbErrors = ctxt->nbErrors + 1;
  }
  if (extra == (char *)0x0) {
    msg = "Memory allocation failed\n";
    extra = (char *)0x0;
  }
  else {
    msg = "Memory allocation failed : %s\n";
  }
  __xmlRaiseError(schannel,channel,data,(void *)0x0,(void *)0x0,0x13,2,XML_ERR_FATAL,(char *)0x0,0,
                  extra,(char *)0x0,(char *)0x0,0,0,msg);
  return;
}

Assistant:

static void
xmlRngVErrMemory(xmlRelaxNGValidCtxtPtr ctxt, const char *extra)
{
    xmlStructuredErrorFunc schannel = NULL;
    xmlGenericErrorFunc channel = NULL;
    void *data = NULL;

    if (ctxt != NULL) {
        if (ctxt->serror != NULL)
	    schannel = ctxt->serror;
	else
	    channel = ctxt->error;
        data = ctxt->userData;
        ctxt->nbErrors++;
    }
    if (extra)
        __xmlRaiseError(schannel, channel, data,
                        NULL, NULL, XML_FROM_RELAXNGV,
                        XML_ERR_NO_MEMORY, XML_ERR_FATAL, NULL, 0, extra,
                        NULL, NULL, 0, 0,
                        "Memory allocation failed : %s\n", extra);
    else
        __xmlRaiseError(schannel, channel, data,
                        NULL, NULL, XML_FROM_RELAXNGV,
                        XML_ERR_NO_MEMORY, XML_ERR_FATAL, NULL, 0, NULL,
                        NULL, NULL, 0, 0, "Memory allocation failed\n");
}